

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_list.c
# Opt level: O0

void list_store_insert(t_list_store *x,t_symbol *s,int argc,t_atom *argv)

{
  t_float tVar1;
  uint local_2c;
  int index;
  t_atom *argv_local;
  int argc_local;
  t_symbol *s_local;
  t_list_store *x_local;
  
  if (1 < argc) {
    tVar1 = atom_getfloat(argv);
    local_2c = (uint)tVar1;
    if ((int)local_2c < 0) {
      pd_error(x,"list_store_insert: index %d out of range",(ulong)local_2c);
    }
    else {
      if ((x->x_alist).l_n < (int)local_2c) {
        local_2c = (x->x_alist).l_n;
      }
      list_store_doinsert(x,s,argc + -1,argv + 1,local_2c);
    }
  }
  return;
}

Assistant:

static void list_store_insert(t_list_store *x, t_symbol *s,
    int argc, t_atom *argv)
{
    if (argc > 1)
    {
        int index = atom_getfloat(argv);
        if (index < 0)
        {
            pd_error(x, "list_store_insert: index %d out of range", index);
            return;
        } else if (index > x->x_alist.l_n)
            index = x->x_alist.l_n;
        list_store_doinsert(x, s, --argc, ++argv, index);
    }
}